

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall chaiscript::parser::ChaiScript_Parser::Statements(ChaiScript_Parser *this)

{
  bool bVar1;
  undefined8 uVar2;
  string *in_RDI;
  ChaiScript_Parser *in_stack_00000010;
  ChaiScript_Parser *in_stack_00000050;
  ChaiScript_Parser *in_stack_00000088;
  Position start;
  bool saw_eol;
  bool has_more;
  bool retval;
  bool in_stack_0000014f;
  ChaiScript_Parser *in_stack_00000150;
  ChaiScript_Parser *in_stack_000001b0;
  ChaiScript_Parser *in_stack_ffffffffffffff40;
  allocator *this_00;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar3;
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  eval_error *in_stack_ffffffffffffff70;
  ChaiScript_Parser *in_stack_ffffffffffffff88;
  File_Position local_6c [3];
  allocator local_51;
  string local_50 [32];
  ChaiScript_Parser *this_01;
  undefined5 in_stack_fffffffffffffff0;
  byte bVar4;
  char cVar5;
  byte bVar6;
  
  bVar6 = 0;
  cVar5 = '\x01';
  bVar4 = 1;
  while( true ) {
    while( true ) {
      while( true ) {
        if (cVar5 == '\0') {
          return (bool)(bVar6 & 1);
        }
        this_01 = *(ChaiScript_Parser **)((long)&in_RDI[0x65].field_2 + 8);
        bVar1 = Def(in_stack_00000150,in_stack_0000014f);
        if (((((!bVar1) && (bVar1 = Try(in_stack_00000150), !bVar1)) &&
             (bVar1 = If(in_stack_000001b0), !bVar1)) &&
            ((bVar1 = While(in_stack_00000050), !bVar1 && (bVar1 = Class(in_stack_00000010), !bVar1)
             ))) && ((bVar1 = For(in_stack_00000050), !bVar1 &&
                     (bVar1 = Switch(in_stack_00000088), !bVar1)))) break;
        if ((bVar4 & 1) == 0) {
          uVar2 = __cxa_allocate_exception(0x90);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_50,"Two function definitions missing line separator",&local_51);
          File_Position::File_Position(local_6c,(int)this_01,(int)((ulong)this_01 >> 0x20));
          std::
          __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_stack_ffffffffffffff40);
          exception::eval_error::eval_error
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     (File_Position *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_RDI);
          __cxa_throw(uVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
        }
        cVar5 = '\x01';
        bVar6 = 1;
        bVar4 = 1;
      }
      bVar1 = Return(in_stack_ffffffffffffff88);
      if (((bVar1) || (bVar1 = Break(in_stack_ffffffffffffff88), bVar1)) ||
         ((bVar1 = Continue(in_stack_ffffffffffffff88), bVar1 || (bVar1 = Equation(this_01), bVar1))
         )) break;
      bVar1 = Block((ChaiScript_Parser *)
                    CONCAT17(bVar6,CONCAT16(cVar5,CONCAT15(bVar4,in_stack_fffffffffffffff0))));
      if ((bVar1) || (bVar1 = Eol(in_stack_ffffffffffffff40), bVar1)) {
        cVar5 = '\x01';
        bVar6 = 1;
        bVar4 = 1;
      }
      else {
        cVar5 = '\0';
      }
    }
    if ((bVar4 & 1) == 0) break;
    cVar5 = '\x01';
    bVar6 = 1;
    bVar4 = 0;
  }
  uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffff60);
  uVar2 = __cxa_allocate_exception(0x90);
  this_00 = (allocator *)&stack0xffffffffffffff6f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff70,"Two expressions missing line separator",this_00);
  File_Position::File_Position
            ((File_Position *)&stack0xffffffffffffff64,(int)this_01,(int)((ulong)this_01 >> 0x20));
  std::
  __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)this_00);
  exception::eval_error::eval_error
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (File_Position *)CONCAT44(in_stack_ffffffffffffff64,uVar3),in_RDI);
  __cxa_throw(uVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
}

Assistant:

bool Statements() {
        bool retval = false;

        bool has_more = true;
        bool saw_eol = true;

        while (has_more) {
          const auto start = m_position;
          if (Def() || Try() || If() || While() || Class() || For() || Switch()) {
            if (!saw_eol) {
              throw exception::eval_error("Two function definitions missing line separator", File_Position(start.line, start.col), *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = true;
          }
          else if (Return() || Break() || Continue() || Equation()) {
            if (!saw_eol) {
              throw exception::eval_error("Two expressions missing line separator", File_Position(start.line, start.col), *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = false;
          }
          else if (Block() || Eol()) {
            has_more = true;
            retval = true;
            saw_eol = true;
          }
          else {
            has_more = false;
          }
        }

        return retval;
      }